

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O1

vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> * __thiscall
chaiscript::bootstrap::Bootstrap::
do_return_boxed_value_vector<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>(chaiscript::dispatch::Proxy_Function_Base::*)()const>
          (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
           *__return_storage_ptr__,Bootstrap *this,offset_in_Proxy_Function_Base_to_subr f,
          Proxy_Function_Base *b)

{
  long *plVar1;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *t;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  v;
  Boxed_Value BStack_48;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_38;
  
  plVar1 = (long *)((long)&b->_vptr_Proxy_Function_Base + f);
  if (((ulong)this & 1) != 0) {
    this = *(Bootstrap **)(this + *plVar1 + -1);
  }
  (*(code *)this)(&local_38,plVar1);
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (t = local_38.
           super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      t != local_38.
           super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; t = t + 1) {
    detail::const_var_impl<chaiscript::dispatch::Proxy_Function_Base_const>((detail *)&BStack_48,t);
    Catch::clara::std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
    emplace_back<chaiscript::Boxed_Value>(__return_storage_ptr__,&BStack_48);
    if (BStack_48.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (BStack_48.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  Catch::clara::std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Boxed_Value> do_return_boxed_value_vector(FunctionType f, const dispatch::Proxy_Function_Base *b) {
      auto v = (b->*f)();

      std::vector<Boxed_Value> vbv;

      for (const auto &o : v) {
        vbv.push_back(const_var(o));
      }

      return vbv;
    }